

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testConversion.cpp
# Opt level: O0

void (anonymous_namespace)::
     testTiledImageChannel<Imath_3_2::half,(Imf_3_4::PixelType)1,unsigned_int,(Imf_3_4::PixelType)0>
               (char *fileName,int width,int height,Compression compression)

{
  uint t1;
  Compression CVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  Compression *pCVar6;
  char *pcVar7;
  half *phVar8;
  uint *puVar9;
  Compression in_ECX;
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  float fVar10;
  int x_1;
  int y_1;
  TiledInputFile in;
  FrameBuffer fb_1;
  Array2D<unsigned_int> inPixels;
  TiledOutputFile out;
  FrameBuffer fb;
  Header hdr;
  int x;
  int y;
  Array2D<Imath_3_2::half> outPixels;
  float in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffd84;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 uVar12;
  undefined4 in_stack_fffffffffffffd8c;
  Array2D<Imath_3_2::half> *in_stack_fffffffffffffd90;
  int local_1d8;
  int local_1d4;
  undefined1 local_1d0 [88];
  char local_178 [48];
  Array2D<unsigned_int> local_148;
  undefined1 local_130 [88];
  char local_d8 [52];
  Channel local_a4 [16];
  TileDescription local_94;
  Vec2<float> local_78;
  TileDescription local_70 [3];
  int local_38;
  int local_34;
  Array2D<Imath_3_2::half> local_30;
  Compression local_14;
  int local_10;
  int local_c;
  char *local_8;
  
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  poVar5 = std::operator<<((ostream *)&std::cout,"tiles, compression ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_14);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = std::operator<<(poVar5,"output type ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,1);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = std::operator<<(poVar5,"input type ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0);
  poVar5 = std::operator<<(poVar5,":\n    ");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D
            (in_stack_fffffffffffffd90,CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88)
             ,CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80));
  for (local_34 = 0; iVar4 = local_c, iVar3 = local_10, local_34 < local_10; local_34 = local_34 + 1
      ) {
    for (local_38 = 0; local_38 < local_c; local_38 = local_38 + 1) {
      Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_30,(long)local_34);
      Imath_3_2::half::operator=
                ((half *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 in_stack_fffffffffffffd7c);
    }
  }
  Imath_3_2::Vec2<float>::Vec2(&local_78,0.0,0.0);
  Imf_3_4::Header::Header
            ((Header *)local_70,iVar4,iVar3,1.0,(Vec2 *)&local_78,1.0,INCREASING_Y,ZIP_COMPRESSION);
  Imf_3_4::TileDescription::TileDescription(&local_94,0x43,0x43,ONE_LEVEL,ROUND_DOWN);
  Imf_3_4::Header::setTileDescription(local_70);
  CVar1 = local_14;
  pCVar6 = (Compression *)Imf_3_4::Header::compression();
  *pCVar6 = CVar1;
  pcVar7 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel(local_a4,HALF,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar7,(Channel *)0x22e4ae);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x168bff);
  phVar8 = Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_30,0);
  uVar12 = 0;
  uVar11 = 0;
  Imf_3_4::Slice::Slice
            ((Slice *)(local_130 + 0x20),HALF,(char *)phVar8,2,(long)local_c * 2,1,1,0.0,false,false
            );
  Imf_3_4::FrameBuffer::insert(local_d8,(Slice *)0x22e4ae);
  poVar5 = std::operator<<((ostream *)&std::cout,"writing ");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  pcVar7 = local_8;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledOutputFile::TiledOutputFile
            ((TiledOutputFile *)local_130,pcVar7,(Header *)local_70,iVar3);
  Imf_3_4::TiledOutputFile::setFrameBuffer((FrameBuffer *)local_130);
  iVar3 = Imf_3_4::TiledOutputFile::numXTiles((int)local_130);
  iVar4 = Imf_3_4::TiledOutputFile::numYTiles((int)local_130);
  Imf_3_4::TiledOutputFile::writeTiles((int)local_130,0,iVar3 + -1,0,iVar4 + -1);
  Imf_3_4::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)local_130);
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x168d61);
  Imf_3_4::Header::~Header((Header *)local_70);
  Imf_3_4::Array2D<unsigned_int>::Array2D
            ((Array2D<unsigned_int> *)in_stack_fffffffffffffd90,
             CONCAT44(in_stack_fffffffffffffd8c,uVar12),CONCAT44(in_stack_fffffffffffffd84,uVar11));
  poVar5 = std::operator<<((ostream *)&std::cout,"reading ");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  Imf_3_4::FrameBuffer::FrameBuffer((FrameBuffer *)0x168dc7);
  puVar9 = Imf_3_4::Array2D<unsigned_int>::operator[](&local_148,0);
  uVar11 = 0;
  Imf_3_4::Slice::Slice
            ((Slice *)(local_1d0 + 0x20),UINT,(char *)puVar9,4,(long)local_c << 2,1,1,0.0,false,
             false);
  Imf_3_4::FrameBuffer::insert(local_178,(Slice *)0x22e4ae);
  pcVar7 = local_8;
  iVar3 = Imf_3_4::globalThreadCount();
  Imf_3_4::TiledInputFile::TiledInputFile((TiledInputFile *)local_1d0,pcVar7,iVar3);
  Imf_3_4::TiledInputFile::setFrameBuffer((FrameBuffer *)local_1d0);
  iVar3 = Imf_3_4::TiledInputFile::numXTiles((int)local_1d0);
  iVar4 = Imf_3_4::TiledInputFile::numYTiles((int)local_1d0);
  Imf_3_4::TiledInputFile::readTiles((int)local_1d0,0,iVar3 + -1,0,iVar4 + -1);
  Imf_3_4::TiledInputFile::~TiledInputFile
            ((TiledInputFile *)CONCAT44(in_stack_fffffffffffffd84,uVar11));
  Imf_3_4::FrameBuffer::~FrameBuffer((FrameBuffer *)0x168efa);
  poVar5 = std::operator<<((ostream *)&std::cout,"comparing");
  std::ostream::operator<<(poVar5,std::flush<char,std::char_traits<char>>);
  local_1d4 = 0;
  do {
    if (local_10 <= local_1d4) {
      std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
      remove(local_8);
      Imf_3_4::Array2D<unsigned_int>::~Array2D
                ((Array2D<unsigned_int> *)CONCAT44(in_stack_fffffffffffffd84,uVar11));
      Imf_3_4::Array2D<Imath_3_2::half>::~Array2D
                ((Array2D<Imath_3_2::half> *)CONCAT44(in_stack_fffffffffffffd84,uVar11));
      return;
    }
    for (local_1d8 = 0; local_1d8 < local_c; local_1d8 = local_1d8 + 1) {
      puVar9 = Imf_3_4::Array2D<unsigned_int>::operator[](&local_148,(long)local_1d4);
      t1 = puVar9[local_1d8];
      Imf_3_4::Array2D<Imath_3_2::half>::operator[](&local_30,(long)local_1d4);
      fVar10 = Imath_3_2::half::operator_cast_to_float
                         ((half *)CONCAT44(in_stack_fffffffffffffd84,uVar11));
      bVar2 = anon_unknown.dwarf_7fa20::isEquivalent<unsigned_int>(t1,(uint)(long)fVar10,local_14);
      if (!bVar2) {
        __assert_fail("isEquivalent ( inPixels[y][x], InType (outPixels[y][x]), compression)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testConversion.cpp"
                      ,0x129,
                      "void (anonymous namespace)::testTiledImageChannel(const char *, int, int, Compression) [OutType = Imath_3_2::half, OutTypeTag = Imf_3_4::HALF, InType = unsigned int, InTypeTag = Imf_3_4::UINT]"
                     );
      }
    }
    local_1d4 = local_1d4 + 1;
  } while( true );
}

Assistant:

void
testTiledImageChannel (
    const char fileName[], int width, int height, Compression compression)
{
    cout << "tiles, "
            "compression "
         << compression << ", "
         << "output type " << OutTypeTag << ", "
         << "input type " << InTypeTag << ":\n    " << flush;

    Array2D<OutType> outPixels (height, width);

    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
            outPixels[y][x] = x * 10 + y;

    {
        Header hdr (width, height);

        hdr.setTileDescription (TileDescription (67, 67, ONE_LEVEL));

        hdr.compression () = compression;

        hdr.channels ().insert (
            "X",                   // name
            Channel (OutTypeTag)); // type

        FrameBuffer fb;

        fb.insert (
            "X", // name
            Slice (
                OutTypeTag,                         // type
                (char*) &outPixels[0][0],           // base
                sizeof (outPixels[0][0]),           // xStride
                sizeof (outPixels[0][0]) * width)); // yStride

        cout << "writing " << flush;

        TiledOutputFile out (fileName, hdr);
        out.setFrameBuffer (fb);
        out.writeTiles (0, out.numXTiles () - 1, 0, out.numYTiles () - 1);
    }

    Array2D<InType> inPixels (height, width);

    {
        cout << "reading " << flush;

        FrameBuffer fb;

        fb.insert (
            "X", // name
            Slice (
                InTypeTag,                         // type
                (char*) &inPixels[0][0],           // base
                sizeof (inPixels[0][0]),           // xStride
                sizeof (inPixels[0][0]) * width)); // yStride

        TiledInputFile in (fileName);
        in.setFrameBuffer (fb);
        in.readTiles (0, in.numXTiles () - 1, 0, in.numYTiles () - 1);
    }

    cout << "comparing" << flush;

    for (int y = 0; y < height; ++y)
    {
        for (int x = 0; x < width; ++x)
        {
            assert (isEquivalent (
                inPixels[y][x], InType (outPixels[y][x]), compression));
        }
    }

    cout << endl;

    remove (fileName);
}